

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall Divide<4,_0,_4>::propagate(Divide<4,_0,_4> *this)

{
  int iVar1;
  IntVar *pIVar2;
  IntVar *pIVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  pIVar2 = (this->x).var;
  pIVar3 = (this->y).var;
  lVar12 = (long)(this->x).b;
  lVar9 = (pIVar2->min).v + lVar12;
  iVar6 = (pIVar2->max).v;
  lVar13 = (long)(pIVar3->min).v;
  lVar14 = (long)(pIVar3->max).v;
  pIVar3 = (this->z).var;
  lVar11 = (long)(this->z).b;
  lVar8 = (pIVar3->min).v + lVar11;
  iVar1 = (pIVar3->max).v;
  lVar7 = (lVar14 + lVar9 + -1) / lVar14;
  if (lVar8 < lVar7) {
    if (so.lazy) {
      iVar4 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[8])();
      uVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar10 = (ulong)uVar5 << 0x20 | (long)iVar4 << 2 | 3;
    }
    else {
      uVar10 = 0;
    }
    pIVar2 = (this->z).var;
    iVar4 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar2,lVar7 - (this->z).b,uVar10,1);
    if ((char)iVar4 == '\0') {
      return false;
    }
  }
  lVar12 = iVar6 + lVar12;
  lVar7 = (lVar13 + -1 + lVar12) / lVar13;
  if (lVar7 < (long)(this->z).b + (long)(((this->z).var)->max).v) {
    if (so.lazy == true) {
      iVar6 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar10 = (ulong)uVar5 << 0x20 | (long)iVar6 << 2 | 3;
    }
    else {
      uVar10 = 0;
    }
    pIVar2 = (this->z).var;
    iVar6 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar2,lVar7 - (this->z).b,uVar10,1);
    if ((char)iVar6 == '\0') {
      return false;
    }
  }
  lVar13 = lVar13 * (lVar8 + -1);
  if ((long)(this->x).b + (long)(((this->x).var)->min).v <= lVar13) {
    if (so.lazy == true) {
      iVar6 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar5 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar10 = (ulong)uVar5 << 0x20 | (long)iVar6 << 2 | 3;
    }
    else {
      uVar10 = 0;
    }
    pIVar2 = (this->x).var;
    iVar6 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar2,~(long)(this->x).b + lVar13 + 2,uVar10,1);
    if ((char)iVar6 == '\0') {
      return false;
    }
  }
  lVar11 = iVar1 + lVar11;
  if (lVar14 * lVar11 < (long)(this->x).b + (long)(((this->x).var)->max).v) {
    if (so.lazy == true) {
      iVar6 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar5 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar10 = (ulong)uVar5 << 0x20 | (long)iVar6 << 2 | 3;
    }
    else {
      uVar10 = 0;
    }
    pIVar2 = (this->x).var;
    iVar6 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar2,lVar14 * lVar11 - (long)(this->x).b,uVar10,1);
    if ((char)iVar6 == '\0') {
      return false;
    }
  }
  if ((0 < lVar11) && (lVar11 = (lVar9 + lVar11 + -1) / lVar11, (((this->y).var)->min).v < lVar11))
  {
    if (so.lazy == true) {
      iVar6 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar5 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar10 = (ulong)uVar5 << 0x20 | (long)iVar6 << 2 | 3;
    }
    else {
      uVar10 = 0;
    }
    pIVar2 = (this->y).var;
    iVar6 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xe])(pIVar2,lVar11,uVar10,1);
    if ((char)iVar6 == '\0') {
      return false;
    }
  }
  if (lVar8 < 2) {
    return true;
  }
  lVar7 = (lVar8 + lVar12 + -2) / (lVar8 + -1);
  if (lVar7 <= (((this->y).var)->max).v) {
    if (so.lazy == true) {
      iVar6 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar5 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar10 = (ulong)uVar5 << 0x20 | (long)iVar6 << 2 | 3;
    }
    else {
      uVar10 = 0;
    }
    pIVar2 = (this->y).var;
    iVar6 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xf])(pIVar2,lVar7 + -1,uVar10,1);
    if ((char)iVar6 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate() override {
		const int64_t x_min = x.getMin();
		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();
		const int64_t y_max = y.getMax();
		const int64_t z_min = z.getMin();
		const int64_t z_max = z.getMax();

		// z >= ceil(x.min / y.max)
		setDom(z, setMin, (x_min + y_max - 1) / y_max, x.getMinLit(), y.getMaxLit());
		// z <= ceil(x.max / y.min)
		setDom(z, setMax, (x_max + y_min - 1) / y_min, x.getMaxLit(), y.getMinLit());

		// x >= y.min * (z.min - 1) + 1
		setDom(x, setMin, y_min * (z_min - 1) + 1, y.getMinLit(), z.getMinLit());
		// x <= y.max * z.max
		setDom(x, setMax, y_max * z_max, y.getMaxLit(), z.getMaxLit());

		// y >= ceil(x.min / z.max)
		if (z_max >= 1) {
			setDom(y, setMin, (x_min + z_max - 1) / z_max, x.getMinLit(), z.getMaxLit());
		}

		// y <= ceil(x.max / z.min-1) - 1
		if (z_min >= 2) {
			setDom(y, setMax, (x_max + z_min - 2) / (z_min - 1) - 1, x.getMaxLit(), z.getMinLit());
		}

		return true;
	}